

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::NumberFormatPartsBuilder::GetPartTypeString
          (NumberFormatPartsBuilder *this,UNumberFormatFields field)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  
  pJVar1 = (((this->sc).ptr)->super_ScriptContextBase).javascriptLibrary;
  switch(field) {
  case UNUM_INTEGER_FIELD:
    BVar4 = JavascriptNumber::IsNan(this->num);
    if (BVar4 != 0) {
      pJVar6 = StringCache::GetIntlNanPart(&pJVar1->stringCache);
      return pJVar6;
    }
    bVar3 = NumberUtilities::IsFinite(this->num);
    if (!bVar3) {
      pJVar6 = StringCache::GetIntlInfinityPart(&pJVar1->stringCache);
      return pJVar6;
    }
    pJVar6 = StringCache::GetIntlIntegerPart(&pJVar1->stringCache);
    return pJVar6;
  case UNUM_FRACTION_FIELD:
    pJVar6 = StringCache::GetIntlFractionPart(&pJVar1->stringCache);
    return pJVar6;
  case UNUM_DECIMAL_SEPARATOR_FIELD:
    pJVar6 = StringCache::GetIntlDecimalPart(&pJVar1->stringCache);
    return pJVar6;
  case UNUM_EXPONENT_SYMBOL_FIELD:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x8f5,"(false)","Unexpected exponent symbol field");
    if (!bVar3) goto LAB_00a34b1b;
    *puVar5 = 0;
    break;
  case UNUM_EXPONENT_SIGN_FIELD:
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    break;
  case UNUM_EXPONENT_FIELD:
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    goto LAB_00a34a4c;
  case UNUM_GROUPING_SEPARATOR_FIELD:
    goto switchD_00a34882_caseD_6;
  case UNUM_CURRENCY_FIELD:
    pJVar6 = StringCache::GetIntlCurrencyPart(&pJVar1->stringCache);
    return pJVar6;
  case UNUM_PERCENT_FIELD:
    pJVar6 = StringCache::GetIntlPercentPart(&pJVar1->stringCache);
    return pJVar6;
  case UNUM_PERMILL_FIELD:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x8fe,"(false)","Unexpected permill field");
    if (!bVar3) goto LAB_00a34b1b;
    *puVar5 = 0;
  case UNUM_SIGN_FIELD:
    if (0.0 < this->num || this->num == 0.0) {
      pJVar6 = StringCache::GetIntlPlusSignPart(&pJVar1->stringCache);
      return pJVar6;
    }
    pJVar6 = StringCache::GetIntlMinusSignPart(&pJVar1->stringCache);
    return pJVar6;
  case ~UNUM_INTEGER_FIELD:
    pJVar6 = StringCache::GetIntlLiteralPart(&pJVar1->stringCache);
    return pJVar6;
  default:
    pJVar6 = StringCache::GetIntlUnknownPart(&pJVar1->stringCache);
    return pJVar6;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0x8f6,"(false)","Unexpected exponent sign field");
  if (bVar3) {
    *puVar5 = 0;
LAB_00a34a4c:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x8f7,"(false)","Unexpected exponent field");
    if (bVar3) {
      *puVar5 = 0;
switchD_00a34882_caseD_6:
      pJVar6 = StringCache::GetIntlGroupPart(&pJVar1->stringCache);
      return pJVar6;
    }
  }
LAB_00a34b1b:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

JavascriptString *GetPartTypeString(UNumberFormatFields field)
        {
            JavascriptLibrary *library = sc->GetLibrary();

            // this is outside the switch because MSVC doesn't like that UnsetField is not a valid enum value
            if (field == UnsetField)
            {
                return library->GetIntlLiteralPartString();
            }

            switch (field)
            {
            case UNUM_INTEGER_FIELD:
            {
                if (JavascriptNumber::IsNan(num))
                {
                    return library->GetIntlNanPartString();
                }
                else if (!NumberUtilities::IsFinite(num))
                {
                    return library->GetIntlInfinityPartString();
                }
                else
                {
                    return library->GetIntlIntegerPartString();
                }
            }
            case UNUM_FRACTION_FIELD: return library->GetIntlFractionPartString();
            case UNUM_DECIMAL_SEPARATOR_FIELD: return library->GetIntlDecimalPartString();

            // The following three should only show up if UNUM_SCIENTIFIC is used, which Intl.NumberFormat doesn't currently use
            case UNUM_EXPONENT_SYMBOL_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent symbol field");
            case UNUM_EXPONENT_SIGN_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent sign field");
            case UNUM_EXPONENT_FIELD: AssertOrFailFastMsg(false, "Unexpected exponent field");

            case UNUM_GROUPING_SEPARATOR_FIELD: return library->GetIntlGroupPartString();
            case UNUM_CURRENCY_FIELD: return library->GetIntlCurrencyPartString();
            case UNUM_PERCENT_FIELD: return library->GetIntlPercentPartString();

            // TODO(jahorto): Determine if this would ever be returned and what it would map to
            case UNUM_PERMILL_FIELD: AssertOrFailFastMsg(false, "Unexpected permill field");

            case UNUM_SIGN_FIELD: return num < 0 ? library->GetIntlMinusSignPartString() : library->GetIntlPlusSignPartString();

            // At the ECMA-402 TC39 call for May 2017, it was decided that we should treat unmapped parts as type: "unknown"
            default: return library->GetIntlUnknownPartString();
            }
        }